

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcoderaw.cc
# Opt level: O0

void __thiscall VarnodeData::restoreXml(VarnodeData *this,Element *el,AddrSpaceManager *manage)

{
  AddrSpaceManager *this_00;
  bool bVar1;
  int iVar2;
  string *psVar3;
  LowlevelError *this_01;
  undefined4 extraout_var;
  AddrSpace *pAVar4;
  Translate *pTVar5;
  undefined4 extraout_var_00;
  VarnodeData *point;
  Translate *trans;
  string local_48 [32];
  int local_28;
  int local_24;
  int4 i;
  int4 num;
  AddrSpaceManager *manage_local;
  Element *el_local;
  VarnodeData *this_local;
  undefined8 *puVar6;
  
  this->space = (AddrSpace *)0x0;
  this->size = 0;
  _i = manage;
  manage_local = (AddrSpaceManager *)el;
  el_local = (Element *)this;
  local_24 = Element::getNumAttributes(el);
  local_28 = 0;
  while( true ) {
    if (local_24 <= local_28) {
      return;
    }
    psVar3 = Element::getAttributeName_abi_cxx11_((Element *)manage_local,local_28);
    bVar1 = std::operator==(psVar3,"space");
    this_00 = _i;
    if (bVar1) break;
    psVar3 = Element::getAttributeName_abi_cxx11_((Element *)manage_local,local_28);
    bVar1 = std::operator==(psVar3,"name");
    if (bVar1) {
      pAVar4 = AddrSpaceManager::getDefaultSpace(_i);
      pTVar5 = AddrSpace::getTrans(pAVar4);
      psVar3 = Element::getAttributeValue_abi_cxx11_((Element *)manage_local,local_28);
      iVar2 = (*(pTVar5->super_AddrSpaceManager)._vptr_AddrSpaceManager[7])(pTVar5,psVar3);
      puVar6 = (undefined8 *)CONCAT44(extraout_var_00,iVar2);
      this->space = (AddrSpace *)*puVar6;
      this->offset = puVar6[1];
      *(undefined8 *)&this->size = puVar6[2];
      return;
    }
    local_28 = local_28 + 1;
  }
  psVar3 = Element::getAttributeValue_abi_cxx11_((Element *)manage_local,local_28);
  pAVar4 = AddrSpaceManager::getSpaceByName(this_00,psVar3);
  this->space = pAVar4;
  if (this->space != (AddrSpace *)0x0) {
    iVar2 = (*this->space->_vptr_AddrSpace[9])(this->space,manage_local,&this->size);
    this->offset = CONCAT44(extraout_var,iVar2);
    return;
  }
  this_01 = (LowlevelError *)__cxa_allocate_exception(0x20);
  Element::getAttributeValue_abi_cxx11_((Element *)manage_local,local_28);
  std::operator+((char *)local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "Unknown space name: ");
  LowlevelError::LowlevelError(this_01,local_48);
  __cxa_throw(this_01,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

void VarnodeData::restoreXml(const Element *el,const AddrSpaceManager *manage)

{
  space = (AddrSpace *)0;
  size = 0;
  int4 num = el->getNumAttributes();
  for(int4 i=0;i<num;++i) {
    if (el->getAttributeName(i)=="space") {
      space = manage->getSpaceByName(el->getAttributeValue(i));
      if (space == (AddrSpace *)0)
	throw LowlevelError("Unknown space name: "+el->getAttributeValue(i));
      offset = space->restoreXmlAttributes(el,size);
      return;
    }
    else if (el->getAttributeName(i)=="name") {
      const Translate *trans = manage->getDefaultSpace()->getTrans();
      const VarnodeData &point(trans->getRegister(el->getAttributeValue(i)));
      *this = point;
      return;
    }
  }
}